

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::LayoutBindingBaseCase::iterate(LayoutBindingBaseCase *this)

{
  TestLog *pTVar1;
  map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  LayoutBindingBaseCase *this_01;
  int iVar2;
  mapped_type *pmVar3;
  code *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestContext *pTVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  qpTestResult testResult;
  pointer pLVar6;
  byte local_233;
  allocator<char> local_232;
  allocator<char> local_231;
  TestLog *local_230;
  LayoutBindingTestResult result;
  string local_200;
  map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e0;
  LayoutBindingBaseCase *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  pTVar5 = ((this->super_TestCase).m_context)->m_testCtx;
  pTVar1 = pTVar5->m_log;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x22])();
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"NotSupported",(allocator<char> *)&local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,fixed_sample_locations_values + 1,&local_232);
    tcu::LogSection::LogSection((LogSection *)local_1b0,(string *)&result,&local_200);
    tcu::LogSection::write((LogSection *)local_1b0,(int)pTVar1,__buf_01,(size_t)pTVar5);
    tcu::LogSection::~LogSection((LogSection *)local_1b0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&result);
    local_1b0 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"This test was not run as minimum requirements were not met.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    tcu::TestLog::endSection(pTVar1);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    pTVar5 = *(TestContext **)CONCAT44(extraout_var,iVar2);
    description = "NotSupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    local_230 = pTVar1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[2])(this);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x27])(this);
    pLVar6 = (this->m_tests).
             super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1e0 = &this->m_sources;
    local_233 = 1;
    local_1d8 = this;
    for (; this_01 = local_1d8, this_00 = local_1e0,
        pLVar6 != (local_1d8->m_tests).
                  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pLVar6 = pLVar6 + 1) {
      initDefaultVSContext_abi_cxx11_((String *)local_1b0,local_1d8);
      result.m_passed = false;
      result.m_notRunForThisContext = false;
      result._2_2_ = 0;
      pmVar3 = std::
               map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)&result);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      initDefaultFSContext_abi_cxx11_((String *)local_1b0,this_01);
      result.m_passed = true;
      result.m_notRunForThisContext = false;
      result._2_2_ = 0;
      pmVar3 = std::
               map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)&result);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      initDefaultCSContext_abi_cxx11_((String *)local_1b0,this_01);
      result.m_passed = true;
      result.m_notRunForThisContext = false;
      result._2_2_ = 0;
      pmVar3 = std::
               map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)&result);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      pcVar4 = (code *)pLVar6->test;
      if (((ulong)pcVar4 & 1) != 0) {
        pTVar5 = *(TestContext **)
                  ((long)&(this_01->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                  *(long *)&pLVar6->field_0x18);
        pcVar4 = *(code **)(pcVar4 + (long)&pTVar5[-1].field_0x5f);
      }
      (*pcVar4)(&result);
      if (result.m_passed == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,pLVar6->name,&local_232);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,pLVar6->description,&local_231);
        tcu::LogSection::LogSection((LogSection *)local_1b0,&local_200,&local_1d0);
        pTVar1 = local_230;
        tcu::LogSection::write((LogSection *)local_1b0,(int)local_230,__buf,(size_t)pTVar5);
        tcu::LogSection::~LogSection((LogSection *)local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_200);
        local_1b0 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__cxx11::string::string((string *)&local_200,(string *)&result.m_reason);
        std::operator<<(&local_1a8,(string *)&local_200);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        tcu::TestLog::endSection(local_230);
      }
      if (result.m_notRunForThisContext == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,pLVar6->name,&local_232);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,pLVar6->description,&local_231);
        tcu::LogSection::LogSection((LogSection *)local_1b0,&local_200,&local_1d0);
        pTVar1 = local_230;
        tcu::LogSection::write((LogSection *)local_1b0,(int)local_230,__buf_00,(size_t)pTVar5);
        tcu::LogSection::~LogSection((LogSection *)local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_200);
        local_1b0 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"This test was not run for this context as it does not apply.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        tcu::TestLog::endSection(local_230);
      }
      local_233 = local_233 & result.m_passed;
      std::__cxx11::string::~string((string *)&result.m_reason);
    }
    (*(local_1d8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x28])(local_1d8);
    iVar2 = (*(this_01->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this_01)
    ;
    pTVar5 = *(TestContext **)CONCAT44(extraout_var_00,iVar2);
    testResult = (byte)~local_233 & QP_TEST_RESULT_FAIL;
    description = "Fail";
    if (local_233 != 0) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult(pTVar5,testResult,description);
  return STOP;
}

Assistant:

LayoutBindingBaseCase::IterateResult LayoutBindingBaseCase::iterate(void)
{
	tcu::TestLog& log	= m_context.getTestContext().getLog();
	bool		  passed = true;

	if (!isSupported())
	{
		log << tcu::TestLog::Section("NotSupported", "");
		log << tcu::TestLog::Message << "This test was not run as minimum requirements were not met."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::EndSection;
		getContext().getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "NotSupported");
		return STOP;
	}

	// init test case (create shader templates and textures)
	init();

	// allocate resources for all subtests
	setupTest();

	for (std::vector<LayoutBindingSubTest>::iterator it = m_tests.begin(); it != m_tests.end(); it++)
	{
		// need to reset templates and their args to a clean state before every
		// test to avoid bleeding.
		m_sources[VertexShader]   = initDefaultVSContext();
		m_sources[FragmentShader] = initDefaultFSContext();
		m_sources[ComputeShader]  = initDefaultCSContext();

		LayoutBindingTestResult result = ((*this).*((*it).test))();
		if (!result.testPassed())
		{
			log << tcu::TestLog::Section((*it).name, (*it).description);
			log << tcu::TestLog::Message << result.getReason() << tcu::TestLog::EndMessage;
			log << tcu::TestLog::EndSection;
		}
		if (!result.runForThisContext())
		{
			log << tcu::TestLog::Section((*it).name, (*it).description);
			log << tcu::TestLog::Message << "This test was not run for this context as it does not apply."
				<< tcu::TestLog::EndMessage;
			log << tcu::TestLog::EndSection;
		}
		passed &= result.testPassed();
	}

	// cleanup resources
	teardownTest();

	/*=========================================================================
	 TEST results
	 =========================================================================*/

	getContext().getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
												passed ? "Pass" : "Fail");

	return STOP;
}